

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O3

string * __thiscall
OpenMD::EAMAdapter::getLatticeType_abi_cxx11_(string *__return_storage_ptr__,EAMAdapter *this)

{
  EAMParameters eamParam;
  EAMParameters local_40;
  
  getEAMParam(&local_40,this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_40.latticeType._M_dataplus._M_p,
             local_40.latticeType._M_dataplus._M_p + local_40.latticeType._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.latticeType._M_dataplus._M_p != &local_40.latticeType.field_2) {
    operator_delete(local_40.latticeType._M_dataplus._M_p,
                    local_40.latticeType.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EAMAdapter::getLatticeType() {
    EAMParameters eamParam = getEAMParam();
    return eamParam.latticeType;
  }